

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

int __thiscall
leveldb::Version::PickLevelForMemTableOutput
          (Version *this,Slice *smallest_user_key,Slice *largest_user_key)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  int64_t iVar5;
  long lVar6;
  int iVar7;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  InternalKey limit;
  InternalKey start;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = 0;
  bVar4 = OverlapInLevel(this,0,smallest_user_key,largest_user_key);
  if (!bVar4) {
    InternalKey::InternalKey(&start,smallest_user_key,0xffffffffffffff,kTypeValue);
    InternalKey::InternalKey(&limit,largest_user_key,0,kTypeDeletion);
    overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar3 = 0;
    do {
      iVar7 = iVar3;
      if (iVar7 == 2) break;
      bVar4 = OverlapInLevel(this,iVar7 + 1,smallest_user_key,largest_user_key);
      if (bVar4) break;
      GetOverlappingInputs(this,iVar7 + 2,&start,&limit,&overlaps);
      iVar5 = TotalFileSize(&overlaps);
      sVar2 = this->vset_->options_->max_file_size;
      lVar6 = sVar2 * 10;
      iVar3 = iVar7 + 1;
    } while (iVar5 == lVar6 || SBORROW8(iVar5,lVar6) != (long)(iVar5 + sVar2 * -10) < 0);
    std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
    ~_Vector_base(&overlaps.
                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 );
    std::__cxx11::string::~string((string *)&limit);
    std::__cxx11::string::~string((string *)&start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int Version::PickLevelForMemTableOutput(const Slice& smallest_user_key,
                                        const Slice& largest_user_key) {
  int level = 0;
  if (!OverlapInLevel(0, &smallest_user_key, &largest_user_key)) {
    // Push to next level if there is no overlap in next level,
    // and the #bytes overlapping in the level after that are limited.
    InternalKey start(smallest_user_key, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey limit(largest_user_key, 0, static_cast<ValueType>(0));
    std::vector<FileMetaData*> overlaps;
    while (level < config::kMaxMemCompactLevel) {
      if (OverlapInLevel(level + 1, &smallest_user_key, &largest_user_key)) {
        break;
      }
      if (level + 2 < config::kNumLevels) {
        // Check that file does not overlap too many grandparent bytes.
        GetOverlappingInputs(level + 2, &start, &limit, &overlaps);
        const int64_t sum = TotalFileSize(overlaps);
        if (sum > MaxGrandParentOverlapBytes(vset_->options_)) {
          break;
        }
      }
      level++;
    }
  }
  return level;
}